

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_nameLength(ENCODING *enc,char *ptr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = (int)ptr;
  do {
    bVar1 = ((byte *)ptr)[1];
    lVar2 = 2;
    if (bVar1 < 0xdc) {
      if (bVar1 - 0xd8 < 4) {
LAB_005f3a1b:
        lVar2 = 4;
      }
      else if (bVar1 == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        if (0x1d < bVar1) {
LAB_005f3a77:
          return (int)ptr - iVar3;
        }
        if ((0x2f400020U >> (bVar1 & 0x1f) & 1) == 0) {
          if (bVar1 != 6) {
            if (bVar1 == 7) goto LAB_005f3a1b;
            goto LAB_005f3a77;
          }
          lVar2 = 3;
        }
      }
    }
    else if (bVar1 == 0xff) {
      if (0xfd < (byte)*ptr) goto LAB_005f3a77;
    }
    else if (bVar1 - 0xdc < 4) goto LAB_005f3a77;
    ptr = (char *)((byte *)ptr + lVar2);
  } while( true );
}

Assistant:

PREFIX(nameLength)(const ENCODING *enc, const char *ptr) {
  const char *start = ptr;
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
#  ifdef XML_NS
    case BT_COLON:
#  endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      ptr += MINBPC(enc);
      break;
    default:
      return (int)(ptr - start);
    }
  }
}